

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O1

long d_string_replace_text_in_range(DString *d,size_t pos,size_t len,char *original,char *replace)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __n;
  ulong uVar6;
  long lVar7;
  char *__dest;
  ulong uVar8;
  
  if ((replace != (char *)0x0 && (original != (char *)0x0 && d != (DString *)0x0)) &&
     (uVar6 = d->currentStringLength, pos <= uVar6)) {
    sVar2 = strlen(original);
    sVar3 = strlen(replace);
    pcVar4 = strstr(d->str + pos,original);
    if (pcVar4 != (char *)0x0) {
      uVar8 = pos + len;
      if (uVar6 <= pos + len) {
        uVar8 = uVar6;
      }
      if (len == 0xffffffffffffffff) {
        uVar8 = uVar6;
      }
      lVar7 = 0;
      do {
        uVar6 = (long)pcVar4 - (long)d->str;
        if (uVar8 + lVar7 <= uVar6) {
          return lVar7;
        }
        if ((sVar2 != 0) && (uVar1 = d->currentStringLength, uVar6 <= uVar1)) {
          uVar5 = uVar6;
          if ((sVar2 != 0xffffffffffffffff) &&
             (__n = uVar1 - (uVar6 + sVar2), uVar6 + sVar2 <= uVar1 && __n != 0)) {
            __dest = d->str + uVar6;
            memmove(__dest,__dest + sVar2,__n);
            uVar5 = d->currentStringLength - sVar2;
          }
          d->currentStringLength = uVar5;
          d->str[uVar5] = '\0';
        }
        d_string_insert(d,(long)pcVar4 - (long)d->str,replace);
        lVar7 = lVar7 + (sVar3 - sVar2);
        pcVar4 = strstr(d->str + sVar3 + uVar6,original);
      } while (pcVar4 != (char *)0x0);
      return lVar7;
    }
  }
  return 0;
}

Assistant:

long d_string_replace_text_in_range(DString * d, size_t pos, size_t len, const char * original, const char * replace) {
	if (d && original && replace) {
		long delta = 0;		// Overall change in length

		if (pos > d->currentStringLength) {
			// Out of range
			return 0;
		}

		long len_o = strlen(original);
		long len_r = strlen(replace);
		long change = len_r - len_o;	// Change in length for each replacement

		size_t stop;

		if (len == -1) {
			stop = d->currentStringLength;
		} else {
			stop = pos + len;

			if (stop > d->currentStringLength) {
				stop = d->currentStringLength;
			}
		}

		char * match = strstr(&(d->str[pos]), original);

		while (match && (match - d->str < stop)) {
			pos = match - d->str;
			d_string_erase(d, match - d->str, len_o);
			d_string_insert(d, match - d->str, replace);

			delta += change;
			stop += change;
			match = strstr(d->str + pos + len_r, original);
		}

		return delta;
	} else {
		return 0;
	}
}